

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O3

void __thiscall embree::XMLWriter::store(XMLWriter *this,SpotLight *light,ssize_t id)

{
  undefined1 auVar1 [16];
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [12];
  float fVar6;
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  vfloat4 a;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_68;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"SpotLight","");
  open(this,(char *)local_88,(int)id);
  if (local_88[0] != local_78) {
    operator_delete(local_88[0]);
  }
  fVar2 = (light->D).field_0.m128[0];
  fVar4 = (light->D).field_0.m128[2];
  fVar3 = -(light->D).field_0.m128[1];
  fVar6 = -fVar4;
  auVar5._8_4_ = 0xffffffff;
  auVar5._0_8_ = 0xffffffffffffffff;
  if (fVar3 * fVar3 + fVar4 * fVar4 + 0.0 <= fVar2 * fVar2 + fVar6 * fVar6 + 0.0) {
    auVar5 = SUB1612((undefined1  [16])0x0,0);
  }
  fVar4 = (float)((uint)fVar4 & auVar5._4_4_);
  fVar6 = (float)(~auVar5._0_4_ & (uint)fVar6);
  fVar12 = (float)(~auVar5._8_4_ & (uint)fVar2 | (uint)fVar3 & auVar5._8_4_);
  fVar2 = fVar4 * fVar4;
  fVar3 = fVar12 * fVar12;
  fVar8 = fVar2 + fVar6 * fVar6 + fVar3;
  fVar9 = fVar2 + fVar2 + 0.0;
  fVar3 = fVar2 + fVar3 + fVar3;
  fVar2 = fVar2 + 0.0 + 0.0;
  auVar10._4_4_ = fVar9;
  auVar10._0_4_ = fVar8;
  auVar10._8_4_ = fVar3;
  auVar10._12_4_ = fVar2;
  auVar11._4_4_ = fVar9;
  auVar11._0_4_ = fVar8;
  auVar11._8_4_ = fVar3;
  auVar11._12_4_ = fVar2;
  auVar11 = rsqrtss(auVar10,auVar11);
  fVar2 = auVar11._0_4_;
  fVar2 = fVar2 * 1.5 - fVar2 * fVar2 * fVar8 * 0.5 * fVar2;
  local_68.m128[0] = fVar2 * fVar6;
  local_68.m128[1] = fVar2 * fVar4;
  local_68.m128[2] = fVar2 * fVar12;
  local_68.m128[3] = fVar2 * 0.0;
  local_48 = (light->D).field_0.m128[0];
  fStack_44 = (light->D).field_0.m128[1];
  fStack_40 = (light->D).field_0.m128[2];
  fStack_3c = (light->D).field_0.m128[3];
  fStack_50 = local_68.m128[1] * local_48 - fStack_44 * local_68.m128[0];
  local_58 = local_68.m128[2] * fStack_44 - fStack_40 * local_68.m128[1];
  fStack_54 = local_68.m128[0] * fStack_40 - local_48 * local_68.m128[2];
  fVar3 = local_68.m128[3] * fStack_3c - fStack_3c * local_68.m128[3];
  fVar2 = local_58 * local_58;
  fVar4 = fStack_54 * fStack_54;
  fVar6 = fVar3 * fVar3;
  fVar12 = fVar4 + fVar2 + fStack_50 * fStack_50;
  fVar8 = fVar6 + fVar2 + fVar2;
  fVar4 = fVar4 + fVar2 + fVar4;
  fVar6 = fVar6 + fVar2 + fVar6;
  auVar7._4_4_ = fVar8;
  auVar7._0_4_ = fVar12;
  auVar7._8_4_ = fVar4;
  auVar7._12_4_ = fVar6;
  auVar1._4_4_ = fVar8;
  auVar1._0_4_ = fVar12;
  auVar1._8_4_ = fVar4;
  auVar1._12_4_ = fVar6;
  auVar11 = rsqrtss(auVar7,auVar1);
  fVar2 = auVar11._0_4_;
  fStack_4c = fVar2 * 1.5 - fVar2 * fVar2 * fVar12 * 0.5 * fVar2;
  local_58 = fStack_4c * local_58;
  fStack_54 = fStack_4c * fStack_54;
  fStack_50 = fStack_4c * fStack_50;
  fStack_4c = fStack_4c * fVar3;
  local_38 = *(undefined8 *)&(light->P).field_0;
  uStack_30 = *(undefined8 *)((long)&(light->P).field_0 + 8);
  store(this,"AffineSpace",(AffineSpace3fa *)&local_68.field_1);
  store(this,"I",&light->I);
  store(this,"angleMin",&light->angleMin);
  store(this,"angleMax",&light->angleMax);
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"SpotLight","");
  close(this,(int)local_a8);
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0]);
  }
  return;
}

Assistant:

void XMLWriter::store(const SceneGraph::SpotLight& light, ssize_t id)
  {
    open("SpotLight",id);
    store("AffineSpace",AffineSpace3fa(frame(light.D),light.P));
    store("I",light.I);
    store("angleMin",light.angleMin);
    store("angleMax",light.angleMax);
    close("SpotLight");
  }